

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_table(LexState *ls,ExpDesc *e)

{
  uint uVar1;
  int iVar2;
  LexToken LVar3;
  uint uVar4;
  BCReg BVar5;
  long lVar6;
  uint *in_RSI;
  long *in_RDI;
  Node *n;
  uint32_t hmask;
  uint32_t i;
  Node *node;
  BCIns *ip;
  ExpDesc en;
  BCInsLine *ilp;
  BCReg kidx;
  TValue *v;
  TValue k;
  ExpDesc val;
  ExpDesc key;
  BCPos pc;
  BCReg freg;
  uint32_t nhash;
  uint32_t narr;
  int fixt;
  int needarr;
  int vcall;
  GCtab *t;
  BCLine line;
  FuncState *fs;
  GCobj *o;
  undefined4 in_stack_fffffffffffffe78;
  BCReg in_stack_fffffffffffffe7c;
  uint32_t in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe84;
  BCIns in_stack_fffffffffffffe88;
  BCIns in_stack_fffffffffffffe8c;
  uint32_t in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe94;
  GCobj *in_stack_fffffffffffffe98;
  FuncState *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint uVar7;
  int local_140 [6];
  uint *local_128;
  BCReg local_11c;
  TValue *local_118;
  TValue local_110;
  ExpDesc local_108;
  anon_union_8_3_2ce71dea_for_u local_f0;
  uint local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  BCPos local_d4;
  uint local_d0;
  int local_cc;
  uint32_t local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  GCtab *local_b8;
  undefined4 local_ac;
  long local_a8;
  uint *local_a0;
  long *local_98;
  GCtab *local_90;
  GCtab *local_88;
  ulong local_80;
  uint32_t local_74;
  anon_union_8_3_2ce71dea_for_u *local_70;
  GCtab *local_68;
  TValue *local_60;
  undefined8 local_58;
  undefined4 local_4c;
  GCtab *local_48;
  TValue *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_20;
  undefined4 local_1c;
  anon_union_8_3_2ce71dea_for_u *local_18;
  uint local_10;
  undefined4 local_c;
  uint *local_8;
  
  local_a8 = *in_RDI;
  local_ac = (undefined4)in_RDI[0xb];
  local_b8 = (GCtab *)0x0;
  local_bc = 0;
  local_c0 = 0;
  local_c4 = 0;
  local_c8 = 1;
  local_cc = 0;
  local_d0 = *(uint *)(local_a8 + 0x34);
  local_a0 = in_RSI;
  local_98 = in_RDI;
  local_d4 = bcemit_INS((FuncState *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe8c);
  local_8 = local_a0;
  local_c = 0xc;
  local_10 = local_d0;
  local_a0[2] = 0xc;
  *local_a0 = local_d0;
  local_a0[3] = 0xffffffff;
  local_a0[4] = 0xffffffff;
  bcreg_reserve((FuncState *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                in_stack_fffffffffffffe7c);
  local_d0 = local_d0 + 1;
  lex_check((LexState *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
            in_stack_fffffffffffffe7c);
  do {
    if (*(int *)((long)local_98 + 0x24) == 0x7d) break;
    local_bc = 0;
    if (*(int *)((long)local_98 + 0x24) == 0x5b) {
      expr_bracket((LexState *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (4 < local_e8) {
        expr_index((FuncState *)&in_stack_fffffffffffffe98->gch,
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      if ((local_e8 == 4) && (iVar2 = expr_numiszero((ExpDesc *)&local_f0.s), iVar2 != 0)) {
        local_c0 = 1;
      }
      else {
        local_cc = local_cc + 1;
      }
      lex_check((LexState *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                in_stack_fffffffffffffe7c);
    }
    else if ((*(int *)((long)local_98 + 0x24) == 0x11f) &&
            (LVar3 = lj_lex_lookahead((LexState *)0x12a79e), LVar3 == 0x3d)) {
      expr_str((LexState *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (ExpDesc *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      lex_check((LexState *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                in_stack_fffffffffffffe7c);
      local_cc = local_cc + 1;
    }
    else {
      local_18 = &local_f0;
      local_1c = 4;
      local_20 = 0;
      local_e8 = 4;
      local_e4 = 0xffffffff;
      local_e0 = 0xffffffff;
      local_70 = &local_f0;
      local_74 = local_c8;
      local_f0 = (anon_union_8_3_2ce71dea_for_u)(double)(int)local_c8;
      local_c8 = local_c8 + 1;
      local_bc = 1;
      local_c0 = 1;
    }
    expr((LexState *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
         (ExpDesc *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (((local_e8 < 5) && (local_e8 != 0)) &&
       ((local_e8 == 3 || ((local_108.k < VKCDATA && (local_108.t == local_108.f)))))) {
      if (local_b8 == (GCtab *)0x0) {
        in_stack_fffffffffffffe98 = *(GCobj **)(local_a8 + 0x10);
        in_stack_fffffffffffffe90 = local_c8;
        if (local_c0 == 0) {
          in_stack_fffffffffffffe90 = 0;
        }
        if (local_cc == 0) {
          in_stack_fffffffffffffe88 = 0;
        }
        else if (local_cc == 1) {
          in_stack_fffffffffffffe88 = 1;
          in_stack_fffffffffffffe8c = in_stack_fffffffffffffe88;
        }
        else {
          iVar2 = 0x1f;
          if (local_cc - 1U != 0) {
            for (; local_cc - 1U >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          in_stack_fffffffffffffe88 = iVar2 + 1;
          in_stack_fffffffffffffe8c = in_stack_fffffffffffffe88;
        }
        in_stack_fffffffffffffe94 = in_stack_fffffffffffffe90;
        local_b8 = lj_tab_new((lua_State *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
        local_11c = const_gc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                             in_stack_fffffffffffffe94);
        *(uint *)(*(long *)(local_a8 + 0x48) + (ulong)local_d4 * 8) =
             (local_d0 + -1) * 0x100 | 0x33 | local_11c << 0x10;
      }
      local_bc = 0;
      expr_kvalue(&local_110,(ExpDesc *)&local_f0.s);
      local_118 = lj_tab_set((lua_State *)
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                             (GCtab *)in_stack_fffffffffffffea0,(cTValue *)in_stack_fffffffffffffe98
                            );
      if ((local_b8->marked & 4) != 0) {
        local_80 = (ulong)*(uint *)(*(long *)(local_a8 + 0x10) + 8);
        local_88 = local_b8;
        local_90 = local_b8;
        local_b8->marked = local_b8->marked & 0xfb;
        (local_b8->gclist).gcptr32 = *(uint32_t *)(local_80 + 0x3c);
        *(uint32_t *)(local_80 + 0x3c) = (uint32_t)local_b8;
      }
      if ((VKLAST < local_108.k) || (local_108.t != local_108.f)) {
        local_58 = *(undefined8 *)(local_a8 + 0x10);
        local_68 = local_b8;
        local_48 = local_b8;
        local_4c = 0xfffffff4;
        (local_118->u32).lo = (uint32_t)local_b8;
        (local_118->field_2).it = 0xfffffff4;
        local_c4 = 1;
        local_60 = local_118;
        local_40 = local_118;
        local_38 = local_58;
        goto LAB_0012abac;
      }
      expr_kvalue(local_118,&local_108);
    }
    else {
LAB_0012abac:
      if (local_108.k != VCALL) {
        expr_toanyreg((FuncState *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (ExpDesc *)0x12abcb);
        local_bc = 0;
      }
      if (local_e8 < 5) {
        expr_index((FuncState *)&in_stack_fffffffffffffe98->gch,
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      bcemit_store(in_stack_fffffffffffffea0,(ExpDesc *)&in_stack_fffffffffffffe98->gch,
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    *(uint *)(local_a8 + 0x34) = local_d0;
    iVar2 = lex_opt((LexState *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
  } while ((iVar2 != 0) ||
          (iVar2 = lex_opt((LexState *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                           ,0), iVar2 != 0));
  lex_match((LexState *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
            in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  if (local_bc != 0) {
    local_128 = (uint *)(*(long *)(local_a8 + 0x48) + (ulong)(*(int *)(local_a8 + 0x28) - 1) * 8);
    local_28 = local_140;
    local_2c = 4;
    local_30 = 0;
    local_140[2] = 4;
    local_140[3] = 0xffffffff;
    local_140[4] = 0xffffffff;
    local_140[0] = local_c8 - 1;
    local_140[1] = 0x43300000;
    if (0x100 < local_c8) {
      *(int *)(local_a8 + 0x28) = *(int *)(local_a8 + 0x28) + -1;
      local_128 = local_128 + -2;
    }
    uVar4 = local_d0 << 8 | 0x3c;
    BVar5 = const_num((FuncState *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (ExpDesc *)(CONCAT44(local_d0 << 8,in_stack_fffffffffffffe80) | 0x3c00000000))
    ;
    *local_128 = uVar4 | BVar5 << 0x10;
    *(undefined1 *)((long)local_128 + -5) = 0;
  }
  if (local_d4 == *(int *)(local_a8 + 0x28) - 1U) {
    *local_a0 = local_d4;
    *(int *)(local_a8 + 0x34) = *(int *)(local_a8 + 0x34) + -1;
    local_a0[2] = 0xb;
  }
  else {
    local_a0[2] = 0xc;
  }
  if (local_b8 == (GCtab *)0x0) {
    if (local_c0 == 0) {
      local_c8._0_2_ = 0;
    }
    else if (local_c8 < 3) {
      local_c8._0_2_ = 3;
    }
    else {
      if (0x7ff < local_c8) {
        local_c8 = 0x7ff;
      }
    }
    if (local_cc == 0) {
      iVar2 = 0;
    }
    else if (local_cc == 1) {
      iVar2 = 1;
    }
    else {
      iVar2 = 0x1f;
      if (local_cc - 1U != 0) {
        for (; local_cc - 1U >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      iVar2 = iVar2 + 1;
    }
    *(ushort *)(*(long *)(local_a8 + 0x48) + (ulong)local_d4 * 8 + 2) =
         (ushort)local_c8 | (ushort)(iVar2 << 0xb);
  }
  else {
    if ((local_c0 != 0) && (local_b8->asize < local_c8)) {
      lj_tab_reasize((lua_State *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->tab,
                     in_stack_fffffffffffffe94);
    }
    if (local_c4 != 0) {
      uVar4 = (local_b8->node).ptr32;
      uVar1 = local_b8->hmask;
      for (uVar7 = 0; uVar7 <= uVar1; uVar7 = uVar7 + 1) {
        lVar6 = (ulong)uVar4 + (ulong)uVar7 * 0x18;
        if (*(int *)(lVar6 + 4) == -0xc) {
          *(undefined4 *)(lVar6 + 4) = 0xffffffff;
        }
      }
    }
    if (*(uint *)((ulong)*(uint *)(*(long *)(local_a8 + 0x10) + 8) + 0x24) <=
        *(uint *)((ulong)*(uint *)(*(long *)(local_a8 + 0x10) + 8) + 0x20)) {
      lj_gc_step((lua_State *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->token != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->token == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->token == TK_name || (!LJ_52 && ls->token == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(&k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lua_assert(bc_a(ilp->ins) == freg &&
	       bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB));
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lua_assert(tabV(&n->val) == t);
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}